

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

bool __thiscall
ThreadedReplayer::enqueue_create_shader_module
          (ThreadedReplayer *this,Hash hash,VkShaderModuleCreateInfo *create_info,
          VkShaderModule *module)

{
  ulong uVar1;
  uint32_t *binary;
  PFN_vkCreateShaderModule p_Var2;
  PFN_vkDestroyShaderModule p_Var3;
  PFN_vkGetShaderModuleIdentifierEXT p_Var4;
  VkShaderModuleCreateInfo *pVVar5;
  bool bVar6;
  uint32_t uVar7;
  VkResult VVar8;
  uint uVar9;
  PerThreadData *pPVar10;
  size_type sVar11;
  pointer pVVar12;
  FeatureFilter *pFVar13;
  spv_validator_options options;
  VkDevice pVVar14;
  mapped_type *pmVar15;
  pointer pDVar16;
  lock_guard<std::mutex> local_250;
  lock_guard<std::mutex> lock_4;
  lock_guard<std::mutex> holder;
  VkShaderModuleIdentifierEXT ident;
  lock_guard<std::mutex> lock_3;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1f8;
  rep local_1f0;
  rep duration_ns_1;
  time_point end_time_1;
  time_point start_time_1;
  VkShaderModuleValidationCacheCreateInfoEXT validation_info;
  uint i;
  lock_guard<std::mutex> lock_2;
  lock_guard<std::mutex> local_1a8;
  lock_guard<std::mutex> lock_1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_198;
  rep local_190;
  rep duration_ns;
  time_point end_time;
  undefined1 local_178 [6];
  bool ret;
  ValidatorOptions local_158;
  ValidatorOptions validation_opts;
  SpirvTools context;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_140;
  spv_target_env env;
  time_point start_time;
  lock_guard<std::mutex> lock;
  PerThreadData *per_thread;
  VkShaderModule *module_local;
  VkShaderModuleCreateInfo *create_info_local;
  Hash hash_local;
  ThreadedReplayer *this_local;
  __int_type local_100;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  atomic<unsigned_int> *local_f0;
  __int_type local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  atomic<unsigned_int> *local_d8;
  __int_type local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  atomic<unsigned_int> *local_c0;
  __int_type local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  atomic<unsigned_int> *local_a8;
  __int_type local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  atomic<unsigned_int> *local_90;
  __int_type local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  atomic<unsigned_int> *local_78;
  __int_type local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  atomic<unsigned_int> *local_60;
  __int_type_conflict1 local_58;
  rep local_50;
  undefined4 local_44;
  rep local_40;
  atomic<unsigned_long> *local_38;
  __int_type_conflict1 local_30;
  rep local_28;
  undefined4 local_1c;
  rep local_18;
  atomic<unsigned_long> *local_10;
  
  *module = (VkShaderModule)0x0;
  create_info_local = (VkShaderModuleCreateInfo *)hash;
  hash_local = (Hash)this;
  pPVar10 = get_per_thread_data(this);
  if (((VkShaderModuleCreateInfo *)pPVar10->expected_hash == create_info_local) &&
     (pPVar10->expected_tag == RESOURCE_SHADER_MODULE)) {
    pPVar10->acknowledge_parsing_work = true;
    sVar11 = std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::count(&this->masked_shader_modules,(key_type *)&create_info_local);
    if ((sVar11 != 0) ||
       (bVar6 = resource_is_blacklisted(this,RESOURCE_SHADER_MODULE,(Hash)create_info_local), bVar6)
       ) {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)&start_time,&this->internal_enqueue_mutex);
      Fossilize::ObjectCache<VkShaderModule_T_*>::insert_object
                (&this->shader_modules,(Hash)create_info_local,*module,1);
      if ((this->opts).control_block != (SharedControlBlock *)0x0) {
        local_60 = &((this->opts).control_block)->banned_modules;
        local_64 = 1;
        local_68 = 0;
        local_6c = 1;
        LOCK();
        local_70 = (local_60->super___atomic_base<unsigned_int>)._M_i;
        (local_60->super___atomic_base<unsigned_int>)._M_i =
             (local_60->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
      }
      this_local._7_1_ = 1;
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&start_time);
    }
    else {
      if ((((this->opts).spirv_validate & 1U) != 0) &&
         (bVar6 = has_resource_in_whitelist(this,RESOURCE_SHADER_MODULE,(Hash)create_info_local),
         !bVar6)) {
        tStack_140.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        pVVar12 = std::
                  unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                  ::operator->(&this->device);
        uVar7 = Fossilize::VulkanDevice::get_api_version(pVVar12);
        if (uVar7 == 0) {
          pVVar12 = std::
                    unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                    ::operator->(&this->device);
          uVar7 = Fossilize::VulkanDevice::get_api_version(pVVar12);
          if (uVar7 == 0) {
            pVVar12 = std::
                      unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                      ::operator->(&this->device);
            uVar7 = Fossilize::VulkanDevice::get_api_version(pVVar12);
            if (uVar7 == 0) {
              context.impl_._M_t.
              super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
              .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl._4_4_ =
                   SPV_ENV_VULKAN_1_0;
            }
            else {
              context.impl_._M_t.
              super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
              .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl._4_4_ =
                   SPV_ENV_VULKAN_1_1;
            }
          }
          else {
            context.impl_._M_t.
            super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
            .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl._4_4_ =
                 SPV_ENV_VULKAN_1_2;
          }
        }
        else {
          context.impl_._M_t.
          super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
          .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl._4_4_ =
               SPV_ENV_VULKAN_1_3;
        }
        spvtools::SpirvTools::SpirvTools
                  ((SpirvTools *)&validation_opts,
                   context.impl_._M_t.
                   super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                   .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl._4_4_);
        spvtools::ValidatorOptions::ValidatorOptions(&local_158);
        pVVar12 = std::
                  unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                  ::operator->(&this->device);
        pFVar13 = Fossilize::VulkanDevice::get_feature_filter(pVVar12);
        bVar6 = Fossilize::FeatureFilter::supports_scalar_block_layout(pFVar13);
        spvtools::ValidatorOptions::SetScalarBlockLayout(&local_158,bVar6);
        std::function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>::
        function<ThreadedReplayer::enqueue_create_shader_module(unsigned_long,VkShaderModuleCreateInfo_const*,VkShaderModule_T**)::_lambda(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)_1_,void>
                  ((function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>
                    *)local_178,(anon_class_1_0_00000001 *)((long)&end_time.__d.__r + 7));
        spvtools::SpirvTools::SetMessageConsumer
                  ((SpirvTools *)&validation_opts,
                   (function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                    *)local_178);
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        ~function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                   *)local_178);
        uVar1 = create_info->codeSize;
        binary = create_info->pCode;
        options = spvtools::ValidatorOptions::operator_cast_to_spv_validator_options_t_(&local_158);
        end_time.__d.__r._6_1_ =
             spvtools::SpirvTools::Validate
                       ((SpirvTools *)&validation_opts,binary,uVar1 >> 2,options);
        duration_ns = std::chrono::_V2::steady_clock::now();
        lock_1._M_device =
             (mutex_type *)
             std::chrono::operator-
                       ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)&duration_ns,&stack0xfffffffffffffec0);
        local_198.__r =
             (rep)std::chrono::
                  duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                            ((duration<long,_std::ratio<1L,_1000000000L>_> *)&lock_1);
        local_190 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_198);
        local_10 = &this->shader_module_ns;
        local_1c = 0;
        LOCK();
        local_30 = (local_10->super___atomic_base<unsigned_long>)._M_i;
        (local_10->super___atomic_base<unsigned_long>)._M_i =
             (local_10->super___atomic_base<unsigned_long>)._M_i + local_190;
        UNLOCK();
        local_28 = local_190;
        local_18 = local_190;
        if ((end_time.__d.__r._6_1_ & 1) == 0) {
          fprintf(_stderr,"Fossilize WARN: Failed to validate SPIR-V module: %0lX, skipping!\n",
                  create_info_local);
          fflush(_stderr);
          *module = (VkShaderModule)0x0;
          std::lock_guard<std::mutex>::lock_guard(&local_1a8,&this->internal_enqueue_mutex);
          Fossilize::ObjectCache<VkShaderModule_T_*>::insert_object
                    (&this->shader_modules,(Hash)create_info_local,(VkShaderModule_T *)0x0,1);
          local_78 = &this->shader_module_count;
          local_7c = 1;
          local_80 = 0;
          local_84 = 1;
          LOCK();
          local_88 = (local_78->super___atomic_base<unsigned_int>)._M_i;
          (local_78->super___atomic_base<unsigned_int>)._M_i =
               (local_78->super___atomic_base<unsigned_int>)._M_i + 1;
          UNLOCK();
          if ((this->opts).control_block != (SharedControlBlock *)0x0) {
            local_90 = &((this->opts).control_block)->module_validation_failures;
            local_94 = 1;
            local_98 = 0;
            local_9c = 1;
            LOCK();
            local_a0 = (local_90->super___atomic_base<unsigned_int>)._M_i;
            (local_90->super___atomic_base<unsigned_int>)._M_i =
                 (local_90->super___atomic_base<unsigned_int>)._M_i + 1;
            UNLOCK();
          }
          blacklist_resource(this,RESOURCE_SHADER_MODULE,(Hash)create_info_local);
          this_local._7_1_ = 1;
          lock_2._M_device._4_4_ = 1;
          std::lock_guard<std::mutex>::~lock_guard(&local_1a8);
        }
        else {
          lock_2._M_device._4_4_ = 0;
        }
        spvtools::ValidatorOptions::~ValidatorOptions(&local_158);
        spvtools::SpirvTools::~SpirvTools((SpirvTools *)&validation_opts);
        if (lock_2._M_device._4_4_ != 0) goto LAB_0014ced8;
      }
      pVVar12 = std::
                unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
                operator->(&this->device);
      pFVar13 = Fossilize::VulkanDevice::get_feature_filter(pVVar12);
      bVar6 = Fossilize::FeatureFilter::shader_module_is_supported(pFVar13,create_info);
      if (bVar6) {
        pPVar10->triggered_validation_error = false;
        for (validation_info.validationCache._4_4_ = 0; p_Var3 = vkDestroyShaderModule,
            validation_info.validationCache._4_4_ < this->loop_count;
            validation_info.validationCache._4_4_ = validation_info.validationCache._4_4_ + 1) {
          if (*module != (VkShaderModule)0x0) {
            pVVar12 = std::
                      unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                      ::operator->(&this->device);
            pVVar14 = Fossilize::VulkanDevice::get_device(pVVar12);
            (*p_Var3)(pVVar14,*module,(VkAllocationCallbacks *)0x0);
          }
          *module = (VkShaderModule)0x0;
          start_time_1.__d.__r = (duration)0x3b9d3b01;
          if (this->validation_cache != (VkValidationCacheEXT)0x0) {
            create_info->pNext = &start_time_1;
          }
          end_time_1.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
          p_Var2 = vkCreateShaderModule;
          pVVar12 = std::
                    unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                    ::operator->(&this->device);
          pVVar14 = Fossilize::VulkanDevice::get_device(pVVar12);
          VVar8 = (*p_Var2)(pVVar14,create_info,(VkAllocationCallbacks *)0x0,module);
          if (VVar8 == VK_SUCCESS) {
            duration_ns_1 = std::chrono::_V2::steady_clock::now();
            lock_3._M_device =
                 (mutex_type *)
                 std::chrono::operator-
                           ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&duration_ns_1,&end_time_1);
            local_1f8.__r =
                 (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)&lock_3);
            local_1f0 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_1f8)
            ;
            local_38 = &this->shader_module_ns;
            local_44 = 0;
            LOCK();
            local_58 = (local_38->super___atomic_base<unsigned_long>)._M_i;
            (local_38->super___atomic_base<unsigned_long>)._M_i =
                 (local_38->super___atomic_base<unsigned_long>)._M_i + local_1f0;
            UNLOCK();
            local_d8 = &this->shader_module_count;
            local_dc = 1;
            local_e0 = 0;
            local_e4 = 1;
            LOCK();
            local_e8 = (local_d8->super___atomic_base<unsigned_int>)._M_i;
            (local_d8->super___atomic_base<unsigned_int>)._M_i =
                 (local_d8->super___atomic_base<unsigned_int>)._M_i + 1;
            UNLOCK();
            local_50 = local_1f0;
            local_40 = local_1f0;
            if ((this->robustness & 1U) != 0) {
              std::lock_guard<std::mutex>::lock_guard
                        ((lock_guard<std::mutex> *)(ident.identifier + 0x1c),
                         &this->internal_enqueue_mutex);
              pVVar5 = create_info_local;
              pmVar15 = std::
                        unordered_map<VkShaderModule_T_*,_unsigned_long,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>_>
                        ::operator[](&this->shader_module_to_hash,module);
              *pmVar15 = (mapped_type)pVVar5;
              std::lock_guard<std::mutex>::~lock_guard
                        ((lock_guard<std::mutex> *)(ident.identifier + 0x1c));
            }
            if ((validation_info.validationCache._4_4_ == 0) &&
               (bVar6 = std::unique_ptr::operator_cast_to_bool
                                  ((unique_ptr *)&this->module_identifier_db), bVar6)) {
              memset(&holder,0,0x38);
              p_Var4 = vkGetShaderModuleIdentifierEXT;
              holder._M_device._0_4_ = 0x3ba1d6b3;
              pVVar12 = std::
                        unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                        ::operator->(&this->device);
              pVVar14 = Fossilize::VulkanDevice::get_device(pVVar12);
              (*p_Var4)(pVVar14,*module,(VkShaderModuleIdentifierEXT *)&holder);
              std::lock_guard<std::mutex>::lock_guard(&lock_4,&this->module_identifier_db_mutex);
              pDVar16 = std::
                        unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                        ::operator->(&this->module_identifier_db);
              uVar9 = (*pDVar16->_vptr_DatabaseInterface[5])(pDVar16,4,create_info_local);
              if ((uVar9 & 1) == 0) {
                pDVar16 = std::
                          unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                          ::operator->(&this->module_identifier_db);
                (*pDVar16->_vptr_DatabaseInterface[4])
                          (pDVar16,4,create_info_local,(undefined1 *)((long)&ident.pNext + 4),
                           (ulong)(uint)ident.pNext,8);
              }
              std::lock_guard<std::mutex>::~lock_guard(&lock_4);
            }
            if (((this->opts).control_block != (SharedControlBlock *)0x0) &&
               (validation_info.validationCache._4_4_ == 0)) {
              local_f0 = &((this->opts).control_block)->successful_modules;
              local_f4 = 1;
              local_f8 = 0;
              local_fc = 1;
              LOCK();
              local_100 = (local_f0->super___atomic_base<unsigned_int>)._M_i;
              (local_f0->super___atomic_base<unsigned_int>)._M_i =
                   (local_f0->super___atomic_base<unsigned_int>)._M_i + 1;
              UNLOCK();
            }
            if (validation_info.validationCache._4_4_ == 0) {
              pVVar12 = std::
                        unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                        ::operator->(&this->device);
              pFVar13 = Fossilize::VulkanDevice::get_feature_filter(pVVar12);
              Fossilize::FeatureFilter::register_shader_module_info(pFVar13,*module,create_info);
            }
          }
          else {
            fprintf(_stderr,"Fossilize ERROR: Failed to create shader module for hash 0x%016lx.\n",
                    create_info_local);
            fflush(_stderr);
          }
        }
        std::lock_guard<std::mutex>::lock_guard(&local_250,&this->internal_enqueue_mutex);
        Fossilize::ObjectCache<VkShaderModule_T_*>::insert_object
                  (&this->shader_modules,(Hash)create_info_local,*module,create_info->codeSize);
        std::lock_guard<std::mutex>::~lock_guard(&local_250);
        if ((pPVar10->triggered_validation_error & 1U) == 0) {
          whitelist_resource(this,RESOURCE_SHADER_MODULE,(Hash)create_info_local);
        }
        else {
          blacklist_resource(this,RESOURCE_SHADER_MODULE,(Hash)create_info_local);
        }
        this_local._7_1_ = 1;
      }
      else {
        fprintf(_stderr,"Fossilize WARN: Shader module %0lx is not supported on this device.\n",
                create_info_local);
        fflush(_stderr);
        *module = (VkShaderModule)0x0;
        std::lock_guard<std::mutex>::lock_guard
                  ((lock_guard<std::mutex> *)&stack0xfffffffffffffe48,&this->internal_enqueue_mutex)
        ;
        Fossilize::ObjectCache<VkShaderModule_T_*>::insert_object
                  (&this->shader_modules,(Hash)create_info_local,(VkShaderModule_T *)0x0,1);
        local_a8 = &this->shader_module_count;
        local_ac = 1;
        local_b0 = 0;
        local_b4 = 1;
        LOCK();
        local_b8 = (local_a8->super___atomic_base<unsigned_int>)._M_i;
        (local_a8->super___atomic_base<unsigned_int>)._M_i =
             (local_a8->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
        if ((this->opts).control_block != (SharedControlBlock *)0x0) {
          local_c0 = &((this->opts).control_block)->module_validation_failures;
          local_c4 = 1;
          local_c8 = 0;
          local_cc = 1;
          LOCK();
          local_d0 = (local_c0->super___atomic_base<unsigned_int>)._M_i;
          (local_c0->super___atomic_base<unsigned_int>)._M_i =
               (local_c0->super___atomic_base<unsigned_int>)._M_i + 1;
          UNLOCK();
        }
        this_local._7_1_ = 1;
        lock_2._M_device._4_4_ = 1;
        std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xfffffffffffffe48)
        ;
      }
    }
  }
  else {
    fprintf(_stderr,"Fossilize ERROR: Unexpected resource type or hash in blob, ignoring.\n");
    fflush(_stderr);
    this_local._7_1_ = 0;
  }
LAB_0014ced8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool enqueue_create_shader_module(Hash hash, const VkShaderModuleCreateInfo *create_info, VkShaderModule *module) override
	{
		*module = VK_NULL_HANDLE;

		auto &per_thread = get_per_thread_data();
		if (per_thread.expected_hash != hash || per_thread.expected_tag != RESOURCE_SHADER_MODULE)
		{
			LOGE("Unexpected resource type or hash in blob, ignoring.\n");
			return false;
		}

		per_thread.acknowledge_parsing_work = true;

		if (masked_shader_modules.count(hash) || resource_is_blacklisted(RESOURCE_SHADER_MODULE, hash))
		{
			lock_guard<mutex> lock(internal_enqueue_mutex);
			//LOGI("Inserting shader module %016llx.\n", static_cast<unsigned long long>(hash));
			shader_modules.insert_object(hash, *module, 1);
			if (opts.control_block)
				opts.control_block->banned_modules.fetch_add(1, std::memory_order_relaxed);
			return true;
		}

#ifdef FOSSILIZE_REPLAYER_SPIRV_VAL
		if (opts.spirv_validate && !has_resource_in_whitelist(RESOURCE_SHADER_MODULE, hash))
		{
			auto start_time = chrono::steady_clock::now();
			spv_target_env env;
			if (device->get_api_version() >= VK_VERSION_1_3)
				env = SPV_ENV_VULKAN_1_3;
			else if (device->get_api_version() >= VK_VERSION_1_2)
				env = SPV_ENV_VULKAN_1_2;
			else if (device->get_api_version() >= VK_VERSION_1_1)
				env = SPV_ENV_VULKAN_1_1;
			else
				env = SPV_ENV_VULKAN_1_0;

			spvtools::SpirvTools context(env);
			spvtools::ValidatorOptions validation_opts;
			validation_opts.SetScalarBlockLayout(device->get_feature_filter().supports_scalar_block_layout());
			context.SetMessageConsumer([](spv_message_level_t, const char *, const spv_position_t &, const char *message) {
				LOGE("spirv-val: %s\n", message);
			});

			bool ret = context.Validate(create_info->pCode, create_info->codeSize / 4, validation_opts);

			auto end_time = chrono::steady_clock::now();
			auto duration_ns = chrono::duration_cast<chrono::nanoseconds>(end_time - start_time).count();
			shader_module_ns.fetch_add(duration_ns, std::memory_order_relaxed);

			if (!ret)
			{
				LOGW("Failed to validate SPIR-V module: %0" PRIX64 ", skipping!\n", hash);
				*module = VK_NULL_HANDLE;
				lock_guard<mutex> lock(internal_enqueue_mutex);
				//LOGI("Inserting shader module %016llx.\n", static_cast<unsigned long long>(hash));
				shader_modules.insert_object(hash, VK_NULL_HANDLE, 1);
				shader_module_count.fetch_add(1, std::memory_order_relaxed);

				if (opts.control_block)
					opts.control_block->module_validation_failures.fetch_add(1, std::memory_order_relaxed);

				blacklist_resource(RESOURCE_SHADER_MODULE, hash);
				return true;
			}
		}
#endif

		if (!device->get_feature_filter().shader_module_is_supported(create_info))
		{
			LOGW("Shader module %0" PRIx64 " is not supported on this device.\n", hash);
			*module = VK_NULL_HANDLE;

			lock_guard<mutex> lock(internal_enqueue_mutex);
			//LOGI("Inserting shader module %016llx.\n", static_cast<unsigned long long>(hash));
			shader_modules.insert_object(hash, VK_NULL_HANDLE, 1);
			shader_module_count.fetch_add(1, std::memory_order_relaxed);

			if (opts.control_block)
				opts.control_block->module_validation_failures.fetch_add(1, std::memory_order_relaxed);

			return true;
		}

		per_thread.triggered_validation_error = false;

		for (unsigned i = 0; i < loop_count; i++)
		{
			// Avoid leak.
			if (*module != VK_NULL_HANDLE)
				vkDestroyShaderModule(device->get_device(), *module, nullptr);
			*module = VK_NULL_HANDLE;

			VkShaderModuleValidationCacheCreateInfoEXT validation_info = { VK_STRUCTURE_TYPE_SHADER_MODULE_VALIDATION_CACHE_CREATE_INFO_EXT };
			if (validation_cache)
			{
				validation_info.validationCache = validation_cache;
				const_cast<VkShaderModuleCreateInfo *>(create_info)->pNext = &validation_info;
			}

			auto start_time = chrono::steady_clock::now();
			if (vkCreateShaderModule(device->get_device(), create_info, nullptr, module) == VK_SUCCESS)
			{
				auto end_time = chrono::steady_clock::now();
				auto duration_ns = chrono::duration_cast<chrono::nanoseconds>(end_time - start_time).count();
				shader_module_ns.fetch_add(duration_ns, std::memory_order_relaxed);
				shader_module_count.fetch_add(1, std::memory_order_relaxed);

				if (robustness)
				{
					lock_guard<mutex> lock(internal_enqueue_mutex);
					shader_module_to_hash[*module] = hash;
				}

				if (i == 0 && module_identifier_db)
				{
					VkShaderModuleIdentifierEXT ident = { VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT };
					vkGetShaderModuleIdentifierEXT(device->get_device(), *module, &ident);
					std::lock_guard<std::mutex> holder{module_identifier_db_mutex};
					if (!module_identifier_db->has_entry(RESOURCE_SHADER_MODULE, hash))
					{
						module_identifier_db->write_entry(RESOURCE_SHADER_MODULE, hash,
						                                  ident.identifier, ident.identifierSize,
						                                  PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT);
					}
				}

				if (opts.control_block && i == 0)
					opts.control_block->successful_modules.fetch_add(1, std::memory_order_relaxed);

				if (i == 0)
					device->get_feature_filter().register_shader_module_info(*module, create_info);
			}
			else
			{
				LOGE("Failed to create shader module for hash 0x%016" PRIx64 ".\n", hash);
			}
		}

		{
			lock_guard<mutex> lock(internal_enqueue_mutex);
			//LOGI("Inserting shader module %016llx.\n", static_cast<unsigned long long>(hash));
			shader_modules.insert_object(hash, *module, create_info->codeSize);
		}

		// vkCreateShaderModule doesn't generally crash anything, so just deal with blacklisting here
		// rather than in an error callback.
		if (!per_thread.triggered_validation_error)
			whitelist_resource(RESOURCE_SHADER_MODULE, hash);
		else
			blacklist_resource(RESOURCE_SHADER_MODULE, hash);

		return true;
	}